

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O1

bool __thiscall DyndepParser::ParseLet(DyndepParser *this,string *key,EvalString *value,string *err)

{
  Lexer *this_00;
  bool bVar1;
  string local_40;
  
  this_00 = &(this->super_Parser).lexer_;
  bVar1 = Lexer::ReadIdent(this_00,key);
  if (bVar1) {
    bVar1 = Parser::ExpectToken(&this->super_Parser,EQUALS,err);
    if (bVar1) {
      bVar1 = Lexer::ReadEvalString(this_00,value,false,err);
      return bVar1;
    }
    bVar1 = false;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"expected variable name","")
    ;
    bVar1 = Lexer::Error(this_00,&local_40,err);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool DyndepParser::ParseLet(string* key, EvalString* value, string* err) {
  if (!lexer_.ReadIdent(key))
    return lexer_.Error("expected variable name", err);
  if (!ExpectToken(Lexer::EQUALS, err))
    return false;
  if (!lexer_.ReadVarValue(value, err))
    return false;
  return true;
}